

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

void mp_next_slowpath(char **data,int64_t k)

{
  char *pcVar1;
  byte bVar2;
  uint16_t uVar3;
  int iVar4;
  uint32_t uVar5;
  uint64_t uVar6;
  uint32_t len;
  uint64_t u;
  char *save;
  int l;
  uint8_t c;
  int64_t k_local;
  char **data_local;
  
  _l = k;
  do {
    if (_l < 1) {
      return;
    }
    bVar2 = mp_load_u8(data);
    iVar4 = (int)""[bVar2];
    if (iVar4 < 0) {
      if (iVar4 < -0x1f) {
        switch(iVar4) {
        case -0x29:
          uVar5 = mp_load_u32(data);
          mp_load_u8(data);
          *data = *data + uVar5;
          break;
        case -0x28:
          uVar3 = mp_load_u16(data);
          mp_load_u8(data);
          *data = *data + uVar3;
          break;
        case -0x27:
          bVar2 = mp_load_u8(data);
          mp_load_u8(data);
          *data = *data + bVar2;
          break;
        case -0x26:
          uVar5 = mp_load_u32(data);
          _l = (ulong)uVar5 * 2 + _l;
          break;
        case -0x25:
          uVar3 = mp_load_u16(data);
          _l = (ulong)uVar3 * 2 + _l;
          break;
        case -0x24:
          uVar5 = mp_load_u32(data);
          _l = (ulong)uVar5 + _l;
          break;
        case -0x23:
          uVar3 = mp_load_u16(data);
          _l = (ulong)uVar3 + _l;
          break;
        case -0x22:
          uVar5 = mp_load_u32(data);
          *data = *data + uVar5;
          break;
        case -0x21:
          uVar3 = mp_load_u16(data);
          *data = *data + uVar3;
          break;
        case -0x20:
          bVar2 = mp_load_u8(data);
          *data = *data + bVar2;
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h"
                        ,0xc87,"void mp_next_slowpath(const char **, int64_t)");
        }
      }
      else {
        _l = _l - iVar4;
      }
    }
    else if (iVar4 == 0 && _l % 0x40 == 0) {
      for (; 8 < _l; _l = _l + -8) {
        pcVar1 = *data;
        uVar6 = mp_load_u64(data);
        if (uVar6 != (ulong)bVar2 * 0x101010101010101) {
          *data = pcVar1;
          break;
        }
      }
    }
    else {
      *data = *data + iVar4;
    }
    _l = _l + -1;
  } while( true );
}

Assistant:

MP_IMPL void
mp_next_slowpath(const char **data, int64_t k)
{
	for (; k > 0; k--) {
		uint8_t c = mp_load_u8(data);
		int l = mp_parser_hint[c];
		if (mp_likely(l >= 0)) {
			/*
			 *  Same one-byte-encoded-value optimisation.
			 *  Good for skipping tons of NILs, zeros etc.
			 *  Run not more than once per 64 cycles (or about)
			 * in order to avoid degradation for other cases.
			 *  Note that l == 0 means that the last byte (that is
			 * in variable `c`) is one-byte-encoded-value.
			 *  The idea of optimization is to read the next 8 bytes
			 * as one 8byte uint and check if all bytes of that
			 * word are the same value (`c`). If so - skip 8 bytes
			 * at once and repeat.
			 *  A small trick is used to create an 8byte uint that
			 * consists of 8 bytes that equal to one byte (`c`):
			 * by rules of multiplication if multiply an one-byte
			 * value (for example 0xab) by 0x0101010101010101 we
			 * will get 0xabababababababab. That works for any byte.
			 */
			if (mp_unlikely(l == 0 && k % 64 == 0)) {
				/*
				 * Check k > 8 that there are at least 8 values
				 * more expected, that are at least 8 bytes of
				 * total length, that allows us to read 8 bytes.
				 */
				while (k > 8) {
					const char *save = *data;
					uint64_t u = mp_load_u64(data);
					/*
					 * Check that `u` is 8 `c` bytes,
					 * see the trick explanation above.
					 */
					if (u != c * 0x0101010101010101ull) {
						/* Wrong, restore pointer. */
						*data = save;
						break;
					}
					/* Confirm reading of 8 values. */
					k -= 8;
				}
				continue;
			}
			*data += l;
			continue;
		} else if (mp_likely(l > MP_HINT)) {
			k -= l;
			continue;
		}

		uint32_t len;
		switch (l) {
		case MP_HINT_STR_8:
			/* MP_STR (8) */
			len = mp_load_u8(data);
			*data += len;
			break;
		case MP_HINT_STR_16:
			/* MP_STR (16) */
			len = mp_load_u16(data);
			*data += len;
			break;
		case MP_HINT_STR_32:
			/* MP_STR (32) */
			len = mp_load_u32(data);
			*data += len;
			break;
		case MP_HINT_ARRAY_16:
			/* MP_ARRAY (16) */
			k += mp_load_u16(data);
			break;
		case MP_HINT_ARRAY_32:
			/* MP_ARRAY (32) */
			k += mp_load_u32(data);
			break;
		case MP_HINT_MAP_16:
			/* MP_MAP (16) */
			k += 2 * (uint32_t)mp_load_u16(data);
			break;
		case MP_HINT_MAP_32:
			/* MP_MAP (32) */
			k += 2 * (uint64_t)mp_load_u32(data);
			break;
		case MP_HINT_EXT_8:
			/* MP_EXT (8) */
			len = mp_load_u8(data);
			mp_load_u8(data);
			*data += len;
			break;
		case MP_HINT_EXT_16:
			/* MP_EXT (16) */
			len = mp_load_u16(data);
			mp_load_u8(data);
			*data += len;
			break;
		case MP_HINT_EXT_32:
			/* MP_EXT (32) */
			len = mp_load_u32(data);
			mp_load_u8(data);
			*data += len;
			break;
		default:
			mp_unreachable();
		}
	}
}